

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O1

void __thiscall OpenMD::BondStamp::BondStamp(BondStamp *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_58;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__BondStamp_003409f0;
  (this->BondOrder).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033e860;
  (this->BondOrder).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->BondOrder).super_ParameterBase.keyword_.field_2;
  (this->BondOrder).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BondOrder).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BondOrder).super_ParameterBase.optional_ = false;
  (this->BondOrder).super_ParameterBase.defaultValue_ = false;
  (this->BondOrder).super_ParameterBase.empty_ = true;
  (this->BondOrder).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ec98;
  this->hasOverride_ = false;
  (this->orType_)._M_dataplus._M_p = (pointer)&(this->orType_).field_2;
  (this->orType_)._M_string_length = 0;
  (this->orType_).field_2._M_local_buf[0] = '\0';
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar2 = &local_58.first.field_2;
  local_58.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bondOrder","");
  std::__cxx11::string::_M_assign((string *)&(this->BondOrder).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->BondOrder).super_ParameterBase.optional_ = true;
  (this->BondOrder).super_ParameterBase.defaultValue_ = true;
  (this->BondOrder).data_ = 1.0;
  (this->BondOrder).super_ParameterBase.empty_ = false;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bondOrder","");
  if (local_78 == &local_68) {
    local_58.first.field_2._8_8_ = local_68._8_8_;
    local_58.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_58.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_58.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_58.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_58.first._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_58.second = &(this->BondOrder).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

BondStamp::BondStamp() : hasOverride_(false) {
    DefineOptionalParameterWithDefaultValue(BondOrder, "bondOrder", 1);
  }